

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_bary4(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double local_f0;
  double local_e0;
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b0;
  double local_a8;
  double local_98;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT smallest;
  REF_INT i;
  REF_DBL volume;
  double dStack_70;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m13;
  REF_DBL m12;
  REF_DBL m11;
  REF_DBL total;
  REF_DBL *d;
  REF_DBL *c;
  REF_DBL *b;
  REF_DBL *a;
  REF_DBL *bary_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  a = bary;
  bary_local = xyz;
  xyz_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  if (((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
      ((((nodes[1] < 0 || (ref_node->max <= nodes[1])) ||
        ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
       (ref_node->global[nodes[2]] < 0)))) ||
     (((nodes[3] < 0 || (ref_node->max <= nodes[3])) || (ref_node->global[nodes[3]] < 0)))) {
    volume._4_4_ = 3;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb2f,
           "ref_node_bary4",3,"node invalid");
    ref_node_local._4_4_ = volume._4_4_;
  }
  else {
    pdVar2 = ref_node->real + nodes[1] * 0xf;
    pdVar3 = ref_node->real + nodes[2] * 0xf;
    pdVar4 = ref_node->real + nodes[3] * 0xf;
    *bary = ((*xyz - *pdVar4) *
             ((pdVar2[1] - pdVar4[1]) * (pdVar3[2] - pdVar4[2]) +
             -((pdVar3[1] - pdVar4[1]) * (pdVar2[2] - pdVar4[2]))) -
            (xyz[1] - pdVar4[1]) *
            ((*pdVar2 - *pdVar4) * (pdVar3[2] - pdVar4[2]) +
            -((*pdVar3 - *pdVar4) * (pdVar2[2] - pdVar4[2])))) +
            (xyz[2] - pdVar4[2]) *
            ((*pdVar2 - *pdVar4) * (pdVar3[1] - pdVar4[1]) +
            -((*pdVar3 - *pdVar4) * (pdVar2[1] - pdVar4[1])));
    b = ref_node->real + *nodes * 0xf;
    bary[1] = ((*b - *pdVar4) *
               ((xyz[1] - pdVar4[1]) * (pdVar3[2] - pdVar4[2]) +
               -((pdVar3[1] - pdVar4[1]) * (xyz[2] - pdVar4[2]))) -
              (b[1] - pdVar4[1]) *
              ((*xyz - *pdVar4) * (pdVar3[2] - pdVar4[2]) +
              -((*pdVar3 - *pdVar4) * (xyz[2] - pdVar4[2])))) +
              (b[2] - pdVar4[2]) *
              ((*xyz - *pdVar4) * (pdVar3[1] - pdVar4[1]) +
              -((*pdVar3 - *pdVar4) * (xyz[1] - pdVar4[1])));
    c = ref_node->real + nodes[1] * 0xf;
    bary[2] = ((*b - *pdVar4) *
               ((c[1] - pdVar4[1]) * (xyz[2] - pdVar4[2]) +
               -((xyz[1] - pdVar4[1]) * (c[2] - pdVar4[2]))) -
              (b[1] - pdVar4[1]) *
              ((*c - *pdVar4) * (xyz[2] - pdVar4[2]) + -((*xyz - *pdVar4) * (c[2] - pdVar4[2])))) +
              (b[2] - pdVar4[2]) *
              ((*c - *pdVar4) * (xyz[1] - pdVar4[1]) + -((*xyz - *pdVar4) * (c[1] - pdVar4[1])));
    d = ref_node->real + nodes[2] * 0xf;
    m12 = (*b - *xyz) * ((c[1] - xyz[1]) * (d[2] - xyz[2]) + -((d[1] - xyz[1]) * (c[2] - xyz[2])));
    m13 = (b[1] - xyz[1]) * ((*c - *xyz) * (d[2] - xyz[2]) + -((*d - *xyz) * (c[2] - xyz[2])));
    dStack_70 = (b[2] - xyz[2]) * ((*c - *xyz) * (d[1] - xyz[1]) + -((*d - *xyz) * (c[1] - xyz[1])))
    ;
    bary[3] = (m12 - m13) + dStack_70;
    total = (REF_DBL)(ref_node->real + nodes[3] * 0xf);
    m11 = *bary + bary[1] + bary[2] + bary[3];
    if (m11 * 1e+20 <= 0.0) {
      local_98 = -(m11 * 1e+20);
    }
    else {
      local_98 = m11 * 1e+20;
    }
    if (*bary <= 0.0) {
      local_a8 = -*bary;
    }
    else {
      local_a8 = *bary;
    }
    if (local_a8 < local_98) {
      if (m11 * 1e+20 <= 0.0) {
        local_b0 = -(m11 * 1e+20);
      }
      else {
        local_b0 = m11 * 1e+20;
      }
      if (bary[1] <= 0.0) {
        local_c0 = -bary[1];
      }
      else {
        local_c0 = bary[1];
      }
      if (local_c0 < local_b0) {
        if (m11 * 1e+20 <= 0.0) {
          local_c8 = -(m11 * 1e+20);
        }
        else {
          local_c8 = m11 * 1e+20;
        }
        if (bary[2] <= 0.0) {
          local_d8 = -bary[2];
        }
        else {
          local_d8 = bary[2];
        }
        if (local_d8 < local_c8) {
          if (m11 * 1e+20 <= 0.0) {
            local_e0 = -(m11 * 1e+20);
          }
          else {
            local_e0 = m11 * 1e+20;
          }
          if (bary[3] <= 0.0) {
            local_f0 = -bary[3];
          }
          else {
            local_f0 = bary[3];
          }
          if (local_f0 < local_e0) {
            *bary = *bary / m11;
            bary[1] = bary[1] / m11;
            bary[2] = bary[2] / m11;
            bary[3] = bary[3] / m11;
            return 0;
          }
        }
      }
    }
    uVar1 = ref_node_tet_vol(ref_node,nodes,(REF_DBL *)&smallest);
    if (uVar1 == 0) {
      printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",m11,*a,a[1],a[2],
             a[3],"/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
             0xb6d,"ref_node_bary4");
      ref_private_macro_code_rss_2 = 0;
      for (ref_private_macro_code_rss_1 = 1; ref_private_macro_code_rss_1 < 4;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        if (a[ref_private_macro_code_rss_1] < a[ref_private_macro_code_rss_2]) {
          ref_private_macro_code_rss_2 = ref_private_macro_code_rss_1;
        }
      }
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 4;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        a[ref_private_macro_code_rss_1] = 0.0;
      }
      a[ref_private_macro_code_rss_2] = -1.0;
      uVar1 = ref_node_tet_vol((REF_NODE)nodes_local,(REF_INT *)xyz_local,(REF_DBL *)&smallest);
      if (uVar1 == 0) {
        printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n",_smallest,*a,a[1],a[2],a[3]);
        ref_node_local._4_4_ = 4;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xb75,"ref_node_bary4",(ulong)uVar1,"bary vol chk");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb6b,
             "ref_node_bary4",(ulong)uVar1,"bary vol chk");
      ref_node_local._4_4_ = uVar1;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary4(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL total, m11, m12, m13;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  a = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[0] = (m11 - m12 + m13);
  a = ref_node_xyz_ptr(ref_node, nodes[0]);

  b = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[1] = (m11 - m12 + m13);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);

  c = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[2] = (m11 - m12 + m13);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);

  d = xyz;
  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  bary[3] = (m11 - m12 + m13);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_DBL volume;
    REF_INT i, smallest;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2],
           bary[3]);
    /* for walking set the smallest as the direction */
    smallest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] < bary[smallest]) smallest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[smallest] = -1.0;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "bary vol chk");
    printf("vol %.18e modified bary\n%.18e %.18e\n%.18e %.18e\n", volume,
           bary[0], bary[1], bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}